

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

Mat3x3d * __thiscall OpenMD::Thermo::getSystemQuadrupole(Thermo *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  SnapshotManager *this_00;
  Snapshot *pos;
  AtomType *pAVar4;
  undefined8 *in_RSI;
  Snapshot *in_RDI;
  MultipoleAdapter ma;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter fca;
  RealType debyeToCm;
  RealType angstromToM;
  RealType chargeToC;
  Mat3x3d qpole;
  Vector3d dipole;
  Vector3d ri;
  RealType charge;
  Atom *atom;
  Molecule *mol;
  iterator aiter;
  MoleculeIterator miter;
  Snapshot *snap;
  Snapshot *in_stack_fffffffffffffb58;
  Snapshot *in_stack_fffffffffffffb60;
  Atom *in_stack_fffffffffffffb68;
  undefined6 in_stack_fffffffffffffb70;
  AtomType *in_stack_fffffffffffffb78;
  SimInfo *in_stack_fffffffffffffb80;
  RealType in_stack_fffffffffffffb88;
  Vector3<double> *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  Vector<double,_3U> *this_01;
  Snapshot *this_02;
  RectMatrix<double,_3U,_3U> local_3c0;
  RectMatrix<double,_3U,_3U> local_378 [2];
  RectMatrix<double,_3U,_3U> local_2e8 [2];
  RectMatrix<double,_3U,_3U> local_258;
  MultipoleAdapter local_1e0 [10];
  RectMatrix<double,_3U,_3U> local_190;
  FluctuatingChargeAdapter local_148;
  FixedChargeAdapter local_140 [6];
  undefined8 local_110;
  undefined8 local_108;
  double local_100;
  double local_b0;
  Vector<double,_3U> local_a8 [2];
  double local_78;
  Vector<double,_3U> local_70 [2];
  Vector3<double> *local_40;
  Atom *local_38;
  Snapshot *local_30;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  Snapshot *local_18;
  
  this_02 = in_RDI;
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RSI);
  local_18 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((local_18->hasSystemQuadrupole & 1U) == 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_28);
    local_78 = 0.0;
    Vector<double,_3U>::Vector(local_70,&local_78);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffb60,
               (Vector<double,_3U> *)in_stack_fffffffffffffb58);
    local_b0 = 0.0;
    this_01 = local_a8;
    Vector<double,_3U>::Vector(this_01,&local_b0);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffb60,
               (Vector<double,_3U> *)in_stack_fffffffffffffb58);
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58)
    ;
    local_100 = 1.60217733e-19;
    local_108 = 0x3ddb7cdfd9d7bdbb;
    local_110 = 0x39d0e9e8d595a487;
    pos = (Snapshot *)
          SimInfo::beginMolecule
                    (in_stack_fffffffffffffb80,(MoleculeIterator *)in_stack_fffffffffffffb78);
    local_30 = pos;
    while (local_30 != (Snapshot *)0x0) {
      local_38 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffb80,
                                     (iterator *)in_stack_fffffffffffffb78);
      while (local_38 != (Atom *)0x0) {
        StuntDouble::getPos(&in_stack_fffffffffffffb68->super_StuntDouble);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffb60,
                   (Vector3<double> *)in_stack_fffffffffffffb58);
        Snapshot::wrapVector(this_02,(Vector3d *)pos);
        Vector<double,_3U>::operator*=
                  ((Vector<double,_3U> *)in_stack_fffffffffffffb60,(double)in_stack_fffffffffffffb58
                  );
        local_40 = (Vector3<double> *)0x0;
        pAVar4 = Atom::getAtomType(local_38);
        FixedChargeAdapter::FixedChargeAdapter(local_140,pAVar4);
        uVar1 = FixedChargeAdapter::isFixedCharge((FixedChargeAdapter *)0x171c80);
        if ((bool)uVar1) {
          in_stack_fffffffffffffba0 =
               (Vector3<double> *)
               FixedChargeAdapter::getCharge((FixedChargeAdapter *)in_stack_fffffffffffffb60);
          local_40 = in_stack_fffffffffffffba0;
        }
        pAVar4 = Atom::getAtomType(local_38);
        FluctuatingChargeAdapter::FluctuatingChargeAdapter(&local_148,pAVar4);
        bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge((FluctuatingChargeAdapter *)0x171d04);
        if (bVar2) {
          in_stack_fffffffffffffb88 =
               StuntDouble::getFlucQPos((StuntDouble *)in_stack_fffffffffffffb60);
          local_40 = (Vector3<double> *)(in_stack_fffffffffffffb88 + (double)local_40);
        }
        local_40 = (Vector3<double> *)((double)local_40 * local_100);
        in_stack_fffffffffffffb80 = (SimInfo *)((double)local_40 * 0.5);
        outProduct<double>((Vector3<double> *)CONCAT17(uVar1,in_stack_fffffffffffffba8),
                           in_stack_fffffffffffffba0);
        OpenMD::operator*(in_stack_fffffffffffffb88,
                          (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb80);
        RectMatrix<double,_3U,_3U>::operator+=
                  ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb60,
                   (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb58);
        RectMatrix<double,_3U,_3U>::~RectMatrix(&local_190);
        SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x171de3);
        in_stack_fffffffffffffb78 = Atom::getAtomType(local_38);
        MultipoleAdapter::MultipoleAdapter(local_1e0,in_stack_fffffffffffffb78);
        uVar3 = MultipoleAdapter::isDipole((MultipoleAdapter *)this_01);
        if ((bool)uVar3) {
          StuntDouble::getDipole(&in_stack_fffffffffffffb68->super_StuntDouble);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffb68,
                            (double)in_stack_fffffffffffffb60);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_fffffffffffffb68,
                     (Vector<double,_3U> *)in_stack_fffffffffffffb60);
          outProduct<double>((Vector3<double> *)CONCAT17(uVar1,in_stack_fffffffffffffba8),
                             in_stack_fffffffffffffba0);
          OpenMD::operator*(in_stack_fffffffffffffb88,
                            (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb80);
          RectMatrix<double,_3U,_3U>::operator+=
                    ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb60,
                     (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb58);
          RectMatrix<double,_3U,_3U>::~RectMatrix(&local_258);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x171ee8);
          outProduct<double>((Vector3<double> *)CONCAT17(uVar1,in_stack_fffffffffffffba8),
                             in_stack_fffffffffffffba0);
          OpenMD::operator*(in_stack_fffffffffffffb88,
                            (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb80);
          RectMatrix<double,_3U,_3U>::operator+=
                    ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb60,
                     (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb58);
          RectMatrix<double,_3U,_3U>::~RectMatrix(local_2e8);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x171f57);
        }
        uVar1 = MultipoleAdapter::isQuadrupole((MultipoleAdapter *)this_01);
        if ((bool)uVar1) {
          StuntDouble::getQuadrupole(&in_stack_fffffffffffffb68->super_StuntDouble);
          OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb78,
                            (double)CONCAT17(uVar3,CONCAT16(uVar1,in_stack_fffffffffffffb70)));
          OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb78,
                            (double)CONCAT17(uVar3,CONCAT16(uVar1,in_stack_fffffffffffffb70)));
          RectMatrix<double,_3U,_3U>::operator+=
                    ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb60,
                     (RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffffb58);
          RectMatrix<double,_3U,_3U>::~RectMatrix(local_378);
          RectMatrix<double,_3U,_3U>::~RectMatrix(&local_3c0);
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1720ec);
        }
        in_stack_fffffffffffffb68 =
             Molecule::nextAtom((Molecule *)in_stack_fffffffffffffb80,
                                (iterator *)in_stack_fffffffffffffb78);
        local_38 = in_stack_fffffffffffffb68;
      }
      in_stack_fffffffffffffb60 =
           (Snapshot *)
           SimInfo::nextMolecule
                     (in_stack_fffffffffffffb80,(MoleculeIterator *)in_stack_fffffffffffffb78);
      local_30 = in_stack_fffffffffffffb60;
    }
    Snapshot::setSystemQuadrupole(in_stack_fffffffffffffb60,(Mat3x3d *)in_stack_fffffffffffffb58);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1721e1);
  }
  Snapshot::getSystemQuadrupole(in_stack_fffffffffffffb58);
  return (Mat3x3d *)in_RDI;
}

Assistant:

Mat3x3d Thermo::getSystemQuadrupole() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasSystemQuadrupole) {
      SimInfo::MoleculeIterator miter;
      vector<Atom*>::iterator aiter;
      Molecule* mol;
      Atom* atom;
      RealType charge;
      Vector3d ri(0.0);
      Vector3d dipole(0.0);
      Mat3x3d qpole(0.0);

      RealType chargeToC   = 1.60217733e-19;
      RealType angstromToM = 1.0e-10;
      RealType debyeToCm   = 3.33564095198e-30;

      for (mol = info_->beginMolecule(miter); mol != NULL;
           mol = info_->nextMolecule(miter)) {
        for (atom = mol->beginAtom(aiter); atom != NULL;
             atom = mol->nextAtom(aiter)) {
          ri = atom->getPos();
          snap->wrapVector(ri);
          ri *= angstromToM;

          charge = 0.0;

          FixedChargeAdapter fca = FixedChargeAdapter(atom->getAtomType());
          if (fca.isFixedCharge()) { charge = fca.getCharge(); }

          FluctuatingChargeAdapter fqa =
              FluctuatingChargeAdapter(atom->getAtomType());
          if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }

          charge *= chargeToC;

          qpole += 0.5 * charge * outProduct(ri, ri);

          MultipoleAdapter ma = MultipoleAdapter(atom->getAtomType());

          if (ma.isDipole()) {
            dipole = atom->getDipole() * debyeToCm;
            qpole += 0.5 * outProduct(dipole, ri);
            qpole += 0.5 * outProduct(ri, dipole);
          }

          if (ma.isQuadrupole()) {
            qpole += atom->getQuadrupole() * debyeToCm * angstromToM;
          }
        }
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, qpole.getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setSystemQuadrupole(qpole);
    }

    return snap->getSystemQuadrupole();
  }